

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsizegrip.cpp
# Opt level: O3

int __thiscall QSizeGripPrivate::init(QSizeGripPrivate *this,EVP_PKEY_CTX *ctx)

{
  QWidget *this_00;
  LayoutDirection LVar1;
  long in_FS_OFFSET;
  QCursor QStack_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  LVar1 = QWidget::layoutDirection(this_00);
  this->m_corner = (LVar1 == LeftToRight) + BottomLeftCorner;
  QCursor::QCursor(&QStack_28,(LVar1 == LeftToRight) + SizeBDiagCursor);
  QWidget::setCursor(this_00,&QStack_28);
  QCursor::~QCursor(&QStack_28);
  QWidget::setSizePolicy(this_00,(QSizePolicy)0x10000);
  updateTopLevelWidget(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QSizeGripPrivate::init()
{
    Q_Q(QSizeGrip);
    m_corner = q->isLeftToRight() ? Qt::BottomRightCorner : Qt::BottomLeftCorner;

#if !defined(QT_NO_CURSOR)
    q->setCursor(m_corner == Qt::TopLeftCorner || m_corner == Qt::BottomRightCorner
                 ? Qt::SizeFDiagCursor : Qt::SizeBDiagCursor);
#endif
    q->setSizePolicy(QSizePolicy(QSizePolicy::Minimum, QSizePolicy::Fixed));
    updateTopLevelWidget();
}